

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

bool __thiscall LLVMBC::ModuleParseContext::add_type(ModuleParseContext *this,Type *type)

{
  pointer *pppTVar1;
  iterator __position;
  Type *local_8;
  
  __position._M_current =
       (this->types).
       super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->types).
      super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_8 = type;
    std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>::
    _M_realloc_insert<LLVMBC::Type*const&>
              ((vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>> *)&this->types,
               __position,&local_8);
  }
  else {
    *__position._M_current = type;
    pppTVar1 = &(this->types).
                super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppTVar1 = *pppTVar1 + 1;
  }
  return true;
}

Assistant:

bool ModuleParseContext::add_type(Type *type)
{
	types.push_back(type);
	return true;
}